

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rfc5444_reader.c
# Opt level: O3

int rfc5444_reader_handle_packet(rfc5444_reader *parser,uint8_t *buffer,size_t length)

{
  uint32_t *puVar1;
  uint64_t *puVar2;
  uint32_t uVar3;
  rfc5444_reader_addrblock_entry *prVar4;
  rfc5444_reader_tlvblock_entry *prVar5;
  rfc5444_reader_tlvblock_entry *prVar6;
  bool bVar7;
  rfc5444_reader_tlvblock_entry *prVar8;
  byte *pbVar9;
  undefined8 binary;
  uint8_t uVar10;
  rfc5444_reader_tlvblock_entry *prVar11;
  avl_tree *paVar12;
  byte bVar13;
  ushort uVar14;
  rfc5444_result rVar15;
  rfc5444_result rVar16;
  rfc5444_reader_addrblock_entry *prVar17;
  rfc5444_reader_addrblock_entry *prVar18;
  list_entity *plVar19;
  byte bVar20;
  avl_node *paVar21;
  ulong uVar22;
  byte *pbVar23;
  rfc5444_reader_tlvblock_consumer *prVar24;
  uint uVar25;
  uint uVar26;
  byte bVar27;
  ulong in_R9;
  byte bVar28;
  byte *pbVar29;
  byte *pbVar30;
  ulong uVar31;
  uint uVar32;
  rfc5444_reader_tlvblock_consumer *prVar33;
  uint8_t *ptr;
  rfc5444_reader_tlvblock_context context;
  avl_tree entries;
  avl_tree tlv_entries;
  byte *local_188;
  rfc5444_reader_tlvblock_consumer *local_180;
  byte *local_178;
  byte *local_170;
  byte *local_168;
  rfc5444_reader_tlvblock_consumer *local_160;
  ulong local_158;
  undefined1 local_150 [48];
  rfc5444_reader_tlvblock_context local_120;
  rfc5444_reader_tlvblock_consumer *local_88;
  avl_tree local_80;
  rfc5444_reader_tlvblock_entry *local_58;
  rfc5444_reader_tlvblock_entry *local_50;
  avl_node *local_48;
  uint32_t local_40;
  
  rVar15 = RFC5444_TOO_LARGE;
  if (length < 0x10000) {
    memset(&local_120.consumer,0,0x90);
    rVar15 = RFC5444_END_OF_BUFFER;
    if (length != 0) {
      bVar13 = *buffer;
      local_188 = buffer + 1;
      local_120.pkt_version = bVar13 >> 4;
      local_120.pkt_flags = bVar13 & 0xf;
      rVar15 = RFC5444_UNSUPPORTED_VERSION;
      if (bVar13 < 0x10) {
        local_120.has_pktseqno = (_Bool)(bVar13 >> 3);
        if (7 < bVar13) {
          if (length < 3) {
            return -2;
          }
          local_188 = buffer + 3;
          local_120.pkt_seqno = *(ushort *)(buffer + 1) << 8 | *(ushort *)(buffer + 1) >> 8;
        }
        pbVar29 = buffer + length;
        local_120.reader = parser;
        avl_init(&local_80,avl_comp_uint32,true);
        uVar10 = local_120.pkt_flags;
        if (((local_120.pkt_flags & 4) == 0) ||
           (rVar15 = _parse_tlvblock(parser,&local_80,&local_188,pbVar29,'\0'),
           rVar15 == RFC5444_OKAY)) {
          prVar33 = (rfc5444_reader_tlvblock_consumer *)(parser->packet_consumer).list_head.next;
          local_168 = pbVar29;
          local_120.pkt_buffer = buffer;
          local_120.pkt_size = length;
          if ((prVar33->_node).list.prev == (parser->packet_consumer).list_head.prev) {
            prVar24 = (rfc5444_reader_tlvblock_consumer *)0x0;
          }
          else {
            do {
              prVar24 = prVar33;
              if (((prVar24->start_callback !=
                    (_func_rfc5444_result_rfc5444_reader_tlvblock_context_ptr *)0x0) &&
                  (local_120.consumer = prVar24, rVar16 = (*prVar24->start_callback)(&local_120),
                  uVar3 = local_40, rVar16 != RFC5444_OKAY)) ||
                 (((uVar10 & 4) != 0 &&
                  (((prVar24->tlv_callback !=
                     (_func_rfc5444_result_rfc5444_reader_tlvblock_entry_ptr_rfc5444_reader_tlvblock_context_ptr
                      *)0x0 ||
                    (prVar24->block_callback !=
                     (_func_rfc5444_result_rfc5444_reader_tlvblock_context_ptr *)0x0)) &&
                   (rVar16 = _schedule_tlvblock(prVar24,&local_120,&local_80,'\0'), uVar3 = local_40
                   , rVar16 != RFC5444_OKAY)))))) goto LAB_00135504;
              prVar33 = (rfc5444_reader_tlvblock_consumer *)(prVar24->_node).list.next;
            } while ((prVar33->_node).list.prev != (parser->packet_consumer).list_head.prev);
          }
          rVar16 = RFC5444_OKAY;
          uVar3 = local_40;
          if (local_188 < local_168) {
            do {
              local_88 = prVar24;
              pbVar30 = local_168;
              pbVar29 = local_188;
              avl_init((avl_tree *)&stack0xffffffffffffffa8,avl_comp_uint16,true);
              local_150._0_8_ = local_150;
              local_120._do_not_forward = false;
              local_120.msg_type = *pbVar29;
              local_188 = pbVar29 + 1;
              rVar15 = RFC5444_END_OF_BUFFER;
              if (local_188 < pbVar30) {
                uVar32 = (uint)pbVar29[1];
                local_188 = pbVar29 + 2;
                if (pbVar30 <= local_188) goto LAB_00134b41;
                local_188 = pbVar29 + 3;
                uVar26 = (uint)pbVar29[2] << 8;
                if (pbVar30 <= local_188) goto LAB_00134b47;
                uVar25 = (uint)pbVar29[3];
                local_188 = pbVar29 + 4;
                bVar7 = true;
                rVar15 = RFC5444_OKAY;
              }
              else {
                uVar32 = 0;
LAB_00134b41:
                uVar26 = 0;
LAB_00134b47:
                bVar7 = false;
                uVar25 = 0;
              }
              pbVar30 = local_188;
              bVar13 = (byte)uVar32;
              local_120.addr_len = (bVar13 & 0xf) + 1;
              local_120.msg_flags = bVar13 & 0xf0;
              local_120.has_origaddr = (_Bool)(bVar13 >> 7);
              local_170 = pbVar29;
              local_150._8_8_ = local_150._0_8_;
              if ((char)bVar13 < '\0') {
                if (local_188 + local_120.addr_len <= local_168) {
                  local_180 = (rfc5444_reader_tlvblock_consumer *)CONCAT44(local_180._4_4_,uVar25);
                  netaddr_from_binary_prefix
                            (&local_120.orig_addr,local_188,(ulong)local_120.addr_len,'\0',0xff);
                  local_188 = pbVar30 + local_120.addr_len;
                  uVar25 = (uint)local_180;
                  goto LAB_00134bc7;
                }
                rVar15 = RFC5444_END_OF_BUFFER;
                pbVar30 = (byte *)0x0;
LAB_00134cd9:
                local_120.msg_buffer = (uint8_t *)0x0;
              }
              else {
LAB_00134bc7:
                pbVar29 = local_170;
                local_120.has_hoplimit = SUB41((uVar32 & 0x40) >> 6,0);
                if ((uVar32 & 0x40) != 0) {
                  if (bVar7) {
                    rVar15 = RFC5444_OKAY;
                    if (local_188 < local_168) {
                      local_120.hoplimit = *local_188;
                      local_188 = local_188 + 1;
                      goto LAB_00134c0b;
                    }
                    rVar15 = RFC5444_END_OF_BUFFER;
                  }
                  local_120.hoplimit = 0;
                }
LAB_00134c0b:
                local_120.has_hopcount = SUB41((uVar32 & 0x20) >> 5,0);
                if ((uVar32 & 0x20) != 0) {
                  if (rVar15 == RFC5444_OKAY) {
                    rVar15 = RFC5444_OKAY;
                    if (local_188 < local_168) {
                      local_120.hopcount = *local_188;
                      local_188 = local_188 + 1;
                      goto LAB_00134c4b;
                    }
                    rVar15 = RFC5444_END_OF_BUFFER;
                  }
                  local_120.hopcount = 0;
                }
LAB_00134c4b:
                local_120.has_seqno = SUB41((uVar32 & 0x10) >> 4,0);
                if ((uVar32 & 0x10) != 0) {
                  if ((rVar15 == RFC5444_OKAY) &&
                     (rVar15 = RFC5444_END_OF_BUFFER, local_188 < local_168)) {
                    uVar14 = (ushort)*local_188 << 8;
                    local_120.seqno = 0;
                    pbVar30 = local_188 + 1;
                    if (local_188 + 1 < local_168) {
                      local_120.seqno = (uint16_t)local_188[1];
                      rVar15 = RFC5444_OKAY;
                      pbVar30 = local_188 + 2;
                    }
                  }
                  else {
                    uVar14 = 0;
                    local_120.seqno = 0;
                    pbVar30 = local_188;
                  }
                  local_188 = pbVar30;
                  local_120.seqno = local_120.seqno | uVar14;
                }
                uVar22 = (ulong)(uVar25 & 0xffff | uVar26);
                pbVar30 = local_170 + uVar22;
                if (local_168 < pbVar30) {
                  local_188 = local_168;
                  rVar15 = RFC5444_END_OF_BUFFER;
                  goto LAB_00134cd9;
                }
                if ((rVar15 == RFC5444_OKAY) &&
                   (rVar15 = _parse_tlvblock(parser,(avl_tree *)&stack0xffffffffffffffa8,&local_188,
                                             pbVar30,'\0'), rVar15 == RFC5444_OKAY)) {
                  local_178 = pbVar30;
                  local_158 = uVar22;
                  if (local_188 < pbVar30) {
                    do {
                      pbVar29 = local_188;
                      prVar17 = (*parser->malloc_addrblock_entry)();
                      if (prVar17 == (rfc5444_reader_addrblock_entry *)0x0) {
                        rVar15 = RFC5444_OUT_OF_MEMORY;
                        goto LAB_00134cd9;
                      }
                      paVar12 = &prVar17->tlvblock;
                      avl_init(paVar12,avl_comp_uint16,true);
                      pbVar9 = local_178;
                      prVar17->addr_block_ptr = pbVar29;
                      if (pbVar30 <= pbVar29) {
                        prVar17->num_addr = '\0';
                        rVar15 = RFC5444_EMPTY_ADDRBLOCK;
LAB_001354da:
                        (*parser->free_addrblock_entry)(prVar17);
                        uVar22 = local_158;
                        pbVar29 = local_170;
                        goto LAB_00134def;
                      }
                      bVar13 = *pbVar29;
                      pbVar23 = pbVar29 + 1;
                      prVar17->num_addr = bVar13;
                      pbVar30 = pbVar9;
                      if (bVar13 == 0) {
                        rVar15 = RFC5444_EMPTY_ADDRBLOCK;
                        local_188 = pbVar23;
                        goto LAB_001354da;
                      }
                      local_180 = (rfc5444_reader_tlvblock_consumer *)paVar12;
                      if (pbVar23 < local_178) {
                        bVar27 = pbVar29[1];
                        in_R9 = CONCAT71((int7)(in_R9 >> 8),bVar27);
                        pbVar23 = pbVar29 + 2;
                        paVar21 = (avl_node *)prVar17->addr;
                        prVar17->addr[0] = '\0';
                        prVar17->addr[1] = '\0';
                        prVar17->addr[2] = '\0';
                        prVar17->addr[3] = '\0';
                        prVar17->addr[4] = '\0';
                        prVar17->addr[5] = '\0';
                        prVar17->addr[6] = '\0';
                        prVar17->addr[7] = '\0';
                        prVar17->addr[8] = '\0';
                        prVar17->addr[9] = '\0';
                        prVar17->addr[10] = '\0';
                        prVar17->addr[0xb] = '\0';
                        prVar17->addr[0xc] = '\0';
                        prVar17->addr[0xd] = '\0';
                        prVar17->addr[0xe] = '\0';
                        prVar17->addr[0xf] = '\0';
                        prVar17->mid_len = local_120.addr_len;
                        bVar28 = local_120.addr_len;
                        bVar20 = local_120.addr_len;
                        if ((char)bVar27 < '\0') {
                          if (pbVar23 < local_178) {
                            bVar27 = pbVar29[2];
                            local_188 = pbVar29 + 3;
                            prVar17->mid_start = bVar27;
                            rVar15 = RFC5444_BAD_ADDR_HEAD_LENGTH;
                            if (((byte)(bVar27 - 1) < 0xf) && (bVar27 < local_120.addr_len)) {
                              pbVar23 = local_188 + bVar27;
                              if (pbVar23 <= local_178) {
                                local_150._40_4_ = (int)in_R9;
                                local_150[0x18] = local_120.addr_len;
                                local_150._32_8_ = paVar21;
                                memcpy(paVar21,local_188,(ulong)bVar27);
                                in_R9 = local_150._40_8_ & 0xffffffff;
                                prVar17->mid_len = local_150[0x18] - bVar27;
                                paVar21 = (avl_node *)local_150._32_8_;
                                bVar28 = local_150[0x18];
                                bVar20 = local_150[0x18] - bVar27;
                                goto LAB_00134fb2;
                              }
                              rVar15 = RFC5444_END_OF_BUFFER;
                            }
                          }
                          else {
                            prVar17->mid_start = '\0';
                            rVar15 = RFC5444_BAD_ADDR_HEAD_LENGTH;
                            local_188 = pbVar23;
                          }
                        }
                        else {
LAB_00134fb2:
                          rVar16 = (rfc5444_result)((in_R9 & 0xff) >> 5) &
                                   RFC5444_DROP_MSG_BUT_FORWARD;
                          local_188 = pbVar23;
                          switch(rVar16) {
                          case RFC5444_DROP_TLV:
                            rVar16 = RFC5444_OKAY;
                            if (pbVar23 < pbVar9) {
                              bVar27 = *pbVar23;
                              pbVar23 = pbVar23 + 1;
                            }
                            else {
                              rVar16 = RFC5444_END_OF_BUFFER;
                              bVar27 = 0;
                            }
                            prVar17->mid_len = bVar20 - bVar27;
                          case RFC5444_OKAY:
                            goto LAB_00135052;
                          case RFC5444_DROP_ADDRESS:
                            rVar15 = RFC5444_BAD_ADDR_TAIL_LENGTH;
                            if (pbVar23 < pbVar9) {
                              bVar13 = *pbVar23;
                              local_188 = pbVar23 + 1;
                              if (((byte)(bVar13 - 1) < 0xf) && (bVar13 < bVar28)) {
                                uVar22 = (ulong)bVar13;
                                pbVar23 = local_188 + uVar22;
                                if (pbVar23 <= pbVar9) {
                                  memcpy((uint8_t *)((long)paVar21 + (bVar28 - uVar22)),local_188,
                                         uVar22);
                                  in_R9 = in_R9 & 0xffffffff;
                                  prVar17->mid_len = prVar17->mid_len - bVar13;
                                  bVar13 = prVar17->num_addr;
                                  rVar16 = RFC5444_OKAY;
                                  goto LAB_00135052;
                                }
                                rVar15 = RFC5444_END_OF_BUFFER;
                                pbVar30 = local_178;
                              }
                            }
                            break;
                          case RFC5444_DROP_MSG_BUT_FORWARD:
                            rVar15 = RFC5444_BAD_MSG_TAILFLAGS;
                          }
                        }
                        goto LAB_001354da;
                      }
                      prVar17->addr[0] = '\0';
                      prVar17->addr[1] = '\0';
                      prVar17->addr[2] = '\0';
                      prVar17->addr[3] = '\0';
                      prVar17->addr[4] = '\0';
                      prVar17->addr[5] = '\0';
                      prVar17->addr[6] = '\0';
                      prVar17->addr[7] = '\0';
                      prVar17->addr[8] = '\0';
                      prVar17->addr[9] = '\0';
                      prVar17->addr[10] = '\0';
                      prVar17->addr[0xb] = '\0';
                      prVar17->addr[0xc] = '\0';
                      prVar17->addr[0xd] = '\0';
                      prVar17->addr[0xe] = '\0';
                      prVar17->addr[0xf] = '\0';
                      prVar17->mid_len = local_120.addr_len;
                      rVar16 = RFC5444_END_OF_BUFFER;
                      in_R9 = 0;
LAB_00135052:
                      pbVar30 = local_178;
                      prVar17->mid_src = pbVar23;
                      local_188 = pbVar23 + (ulong)prVar17->mid_len * (ulong)bVar13;
                      rVar15 = RFC5444_END_OF_BUFFER;
                      if (local_178 < local_188) goto LAB_001354da;
                      bVar27 = (byte)in_R9 >> 3;
                      in_R9 = CONCAT71((int7)(in_R9 >> 8),bVar27) & 0xffffffffffffff03;
                      switch(bVar27 & 3) {
                      case 0:
                        prVar17->prefixlen = local_120.addr_len << 3;
                        break;
                      case 1:
                        prVar17->prefixes = local_188;
                        local_188 = local_188 + bVar13;
                        break;
                      case 2:
                        prVar17->prefixlen = *local_188;
                        local_188 = local_188 + 1;
                        break;
                      case 3:
                        rVar15 = RFC5444_BAD_MSG_PREFIXFLAGS;
                        goto LAB_001354da;
                      }
                      if (((local_178 < local_188) ||
                          (prVar17->addr_block_size =
                                (long)local_188 - (long)prVar17->addr_block_ptr, rVar15 = rVar16,
                          rVar16 != RFC5444_OKAY)) ||
                         (rVar15 = _parse_tlvblock(parser,(avl_tree *)local_180,&local_188,local_178
                                                   ,bVar13), rVar15 != RFC5444_OKAY))
                      goto LAB_001354da;
                      prVar17->addr_tlv_size =
                           (size_t)(local_188 +
                                   (-(long)prVar17->addr_block_ptr - prVar17->addr_block_size));
                      (prVar17->list_node).next = (list_entity *)local_150;
                      (prVar17->list_node).prev = (list_entity *)local_150._8_8_;
                      plVar19 = (list_entity *)local_150._8_8_;
                      local_150._8_8_ = prVar17;
                      plVar19->next = &prVar17->list_node;
                    } while (local_188 < pbVar30);
                  }
                  local_120.msg_buffer = local_170;
                  local_120.msg_size = local_158;
                  prVar33 = (rfc5444_reader_tlvblock_consumer *)
                            (parser->message_consumer).list_head.next;
                  pbVar29 = local_170;
                  uVar22 = local_158;
                  if ((prVar33->_node).list.prev != (parser->message_consumer).list_head.prev) {
                    local_150._16_8_ = (rfc5444_reader_tlvblock_consumer *)0x0;
                    prVar24 = (rfc5444_reader_tlvblock_consumer *)0x0;
                    do {
                      if ((prVar33->default_msg_consumer != false) ||
                         (prVar33->msg_id == local_120.msg_type)) {
                        local_180 = prVar33;
                        if (prVar24 == (rfc5444_reader_tlvblock_consumer *)0x0) {
                          local_160 = (rfc5444_reader_tlvblock_consumer *)0x0;
                          prVar24 = local_160;
                        }
                        else if (*(int *)(local_150._16_8_ + 0x38) < prVar33->order) {
                          rVar15 = schedule_end_message_cbs
                                             (&local_120,prVar24,
                                              (rfc5444_reader_tlvblock_consumer *)local_150._16_8_,
                                              RFC5444_OKAY);
                          if (rVar15 != RFC5444_OKAY) goto LAB_00134def;
                          local_160 = (rfc5444_reader_tlvblock_consumer *)0x0;
                          prVar24 = local_160;
                        }
                        local_160 = prVar24;
                        prVar33 = local_180;
                        if (local_180->addrblock_consumer == true) {
                          local_120.type = RFC5444_CONTEXT_ADDRESS;
                          prVar18 = (rfc5444_reader_addrblock_entry *)local_150._8_8_;
                          for (prVar17 = (rfc5444_reader_addrblock_entry *)local_150._0_8_;
                              (rfc5444_reader_addrblock_entry *)(prVar17->list_node).prev != prVar18
                              ; prVar17 = (rfc5444_reader_addrblock_entry *)
                                          (prVar17->list_node).next) {
                            local_120.addr_block_buffer = prVar17->addr_block_ptr;
                            local_120.addr_block_size = prVar17->addr_block_size;
                            local_120.addr_tlv_size = prVar17->addr_tlv_size;
                            if (prVar17->num_addr != '\0') {
                              local_150._40_8_ = prVar17->addr;
                              local_150._32_8_ = &prVar17->prefixlen;
                              local_150._24_8_ = &prVar17->tlvblock;
                              uVar31 = 0;
                              do {
                                binary = local_150._40_8_;
                                bVar13 = (byte)uVar31;
                                if (((prVar17->dropAddr).b[uVar31 >> 6] >> (uVar31 & 0x3f) & 1) == 0
                                   ) {
                                  memcpy((uint8_t *)(local_150._40_8_ + (ulong)prVar17->mid_start),
                                         prVar17->mid_src + uVar31 * prVar17->mid_len,
                                         (ulong)prVar17->mid_len);
                                  paVar21 = (avl_node *)(prVar17->prefixes + uVar31);
                                  if (prVar17->prefixes == (uint8_t *)0x0) {
                                    paVar21 = (avl_node *)local_150._32_8_;
                                  }
                                  netaddr_from_binary_prefix
                                            (&local_120.addr,(void *)binary,
                                             (ulong)local_120.addr_len,'\0',
                                             *(uint8_t *)&(paVar21->list).next);
                                  local_120.addr_index = bVar13;
                                  if (local_180->start_callback ==
                                      (_func_rfc5444_result_rfc5444_reader_tlvblock_context_ptr *)
                                      0x0) {
LAB_00135301:
                                    rVar15 = _schedule_tlvblock(local_180,&local_120,
                                                                (avl_tree *)local_150._24_8_,bVar13)
                                    ;
                                  }
                                  else {
                                    local_120.consumer = local_180;
                                    rVar15 = (*local_180->start_callback)(&local_120);
                                    if (rVar15 == RFC5444_OKAY) goto LAB_00135301;
                                  }
                                  if (local_180->end_callback !=
                                      (_func_rfc5444_result_rfc5444_reader_tlvblock_context_ptr__Bool
                                       *)0x0) {
                                    local_120.consumer = local_180;
                                    rVar16 = (*local_180->end_callback)
                                                       (&local_120,rVar15 != RFC5444_OKAY);
                                    if (rVar15 < rVar16) {
                                      rVar15 = rVar16;
                                    }
                                  }
                                  if (rVar15 != RFC5444_OKAY) {
                                    if (rVar15 != RFC5444_DROP_ADDRESS) {
                                      local_180 = (rfc5444_reader_tlvblock_consumer *)
                                                  local_150._16_8_;
                                      uVar22 = local_158;
                                      prVar24 = local_160;
                                      pbVar29 = local_170;
                                      pbVar30 = local_178;
                                      goto LAB_00135441;
                                    }
                                    puVar2 = (prVar17->dropAddr).b + (uVar31 >> 6);
                                    *puVar2 = *puVar2 | 1L << (bVar13 & 0x3f);
                                  }
                                }
                                uVar31 = uVar31 + 1;
                                prVar18 = (rfc5444_reader_addrblock_entry *)local_150._8_8_;
                                uVar22 = local_158;
                                pbVar29 = local_170;
                                pbVar30 = local_178;
                              } while (uVar31 < prVar17->num_addr);
                            }
                          }
                          local_120.addr_block_buffer = (uint8_t *)0x0;
                          prVar24 = local_160;
                          prVar33 = local_180;
                        }
                        else {
                          local_120.type = RFC5444_CONTEXT_MESSAGE;
                          if (local_180->start_callback !=
                              (_func_rfc5444_result_rfc5444_reader_tlvblock_context_ptr *)0x0) {
                            local_120.consumer = local_180;
                            rVar15 = (*local_180->start_callback)(&local_120);
                            if (rVar15 != RFC5444_OKAY) {
                              prVar24 = local_160;
                              if (local_160 == (rfc5444_reader_tlvblock_consumer *)0x0) {
                                prVar24 = prVar33;
                              }
                              goto LAB_0013544a;
                            }
                          }
                          rVar15 = _schedule_tlvblock(prVar33,&local_120,
                                                      (avl_tree *)&stack0xffffffffffffffa8,'\0');
                          prVar24 = local_160;
                          if (local_160 == (rfc5444_reader_tlvblock_consumer *)0x0) {
                            prVar24 = prVar33;
                          }
                          if (rVar15 != RFC5444_OKAY) goto LAB_00135441;
                          local_150._16_8_ = prVar33;
                        }
                      }
                      prVar33 = (rfc5444_reader_tlvblock_consumer *)(prVar33->_node).list.next;
                    } while ((prVar33->_node).list.prev != (parser->message_consumer).list_head.prev
                            );
                    rVar15 = RFC5444_OKAY;
                    local_180 = (rfc5444_reader_tlvblock_consumer *)local_150._16_8_;
LAB_00135441:
                    if (prVar24 != (rfc5444_reader_tlvblock_consumer *)0x0) {
LAB_0013544a:
                      rVar15 = schedule_end_message_cbs(&local_120,prVar24,local_180,rVar15);
                    }
                    goto LAB_00134def;
                  }
                  rVar15 = RFC5444_OKAY;
LAB_00134e0a:
                  local_120.msg_buffer = (uint8_t *)0x0;
                  if ((((local_120._do_not_forward == false) &&
                       (parser->forward_message !=
                        (_func_void_rfc5444_reader_tlvblock_context_ptr_uint8_t_ptr_size_t *)0x0))
                      && (local_120.has_hoplimit == true)) && (1 < local_120.hoplimit)) {
                    local_120.type = RFC5444_CONTEXT_MESSAGE;
                    (*parser->forward_message)(&local_120,pbVar29,uVar22);
                  }
                }
                else {
LAB_00134def:
                  local_120.msg_buffer = (uint8_t *)0x0;
                  if ((rVar15 == RFC5444_DROP_MSG_BUT_FORWARD) || (rVar15 == RFC5444_OKAY))
                  goto LAB_00134e0a;
                }
              }
              prVar17 = (rfc5444_reader_addrblock_entry *)((list_entity *)local_150._0_8_)->prev;
              prVar18 = (rfc5444_reader_addrblock_entry *)local_150._0_8_;
              while (prVar17 != (rfc5444_reader_addrblock_entry *)local_150._8_8_) {
                prVar4 = (rfc5444_reader_addrblock_entry *)(prVar18->list_node).next;
                prVar5 = (rfc5444_reader_tlvblock_entry *)(prVar18->tlvblock).list_head.next;
                prVar6 = (rfc5444_reader_tlvblock_entry *)(prVar5->node).list.next;
                (prVar18->tlvblock).list_head.prev = &(prVar18->tlvblock).list_head;
                (prVar18->tlvblock).list_head.next = &(prVar18->tlvblock).list_head;
                (prVar18->tlvblock).root = (avl_node *)0x0;
                uVar3 = (prVar18->tlvblock).count;
                while (prVar11 = prVar6, uVar3 != 0) {
                  (*parser->free_tlvblock_entry)(prVar5);
                  prVar6 = (rfc5444_reader_tlvblock_entry *)(prVar11->node).list.next;
                  puVar1 = &(prVar18->tlvblock).count;
                  *puVar1 = *puVar1 - 1;
                  prVar5 = prVar11;
                  uVar3 = *puVar1;
                }
                (*parser->free_addrblock_entry)(prVar18);
                prVar18 = prVar4;
                prVar17 = (rfc5444_reader_addrblock_entry *)(prVar4->list_node).prev;
              }
              local_50 = (rfc5444_reader_tlvblock_entry *)&stack0xffffffffffffffa8;
              local_48 = (avl_node *)0x0;
              prVar6 = (rfc5444_reader_tlvblock_entry *)(local_58->node).list.next;
              prVar11 = local_50;
              prVar24 = local_88;
              prVar5 = local_58;
              for (; local_58 = prVar11, prVar8 = prVar6, local_88 = prVar24, local_40 != 0;
                  local_40 = local_40 - 1) {
                (*parser->free_tlvblock_entry)(prVar5);
                prVar6 = (rfc5444_reader_tlvblock_entry *)(prVar8->node).list.next;
                prVar11 = local_58;
                prVar24 = local_88;
                prVar5 = prVar8;
              }
              rVar16 = rVar15 >> 0x1f & rVar15;
              if (rVar15 == RFC5444_DROP_PACKET) {
                rVar16 = RFC5444_DROP_PACKET;
              }
              local_188 = pbVar30;
              uVar3 = 0;
            } while ((rVar16 == RFC5444_OKAY) && (pbVar30 < local_168));
          }
LAB_00135504:
          local_40 = uVar3;
          if (((parser->packet_consumer).count != 0) &&
             (plVar19 = (parser->packet_consumer).list_head.next,
             (prVar24->_node).list.next != plVar19)) {
            do {
              if (prVar24->end_callback !=
                  (_func_rfc5444_result_rfc5444_reader_tlvblock_context_ptr__Bool *)0x0) {
                local_120.consumer = prVar24;
                (*prVar24->end_callback)(&local_120,rVar16 != RFC5444_OKAY);
                plVar19 = (parser->packet_consumer).list_head.next;
              }
              prVar24 = (rfc5444_reader_tlvblock_consumer *)(prVar24->_node).list.prev;
            } while ((prVar24->_node).list.next != plVar19);
          }
          local_80.list_head.prev = &local_80.list_head;
          local_80.root = (avl_node *)0x0;
          prVar6 = (rfc5444_reader_tlvblock_entry *)
                   (((avl_node *)&(local_80.list_head.next)->next)->list).next;
          paVar12 = (avl_tree *)local_80.list_head.prev;
          prVar5 = (rfc5444_reader_tlvblock_entry *)local_80.list_head.next;
          for (; local_80.list_head.next = &paVar12->list_head, prVar11 = prVar6,
              local_80.count != 0; local_80.count = local_80.count - 1) {
            (*parser->free_tlvblock_entry)(prVar5);
            prVar6 = (rfc5444_reader_tlvblock_entry *)(prVar11->node).list.next;
            paVar12 = (avl_tree *)local_80.list_head.next;
            prVar5 = prVar11;
          }
          rVar15 = RFC5444_OKAY;
          if (rVar16 != RFC5444_DROP_PACKET) {
            rVar15 = rVar16;
          }
        }
      }
    }
  }
  return rVar15;
}

Assistant:

enum rfc5444_result
rfc5444_reader_handle_packet(struct rfc5444_reader *parser, const uint8_t *buffer, size_t length)
{
  struct rfc5444_reader_tlvblock_context context;
  struct avl_tree entries;
  struct rfc5444_reader_tlvblock_consumer *consumer, *last_started;
  const uint8_t *ptr, *eob;
  bool has_tlv;
  uint8_t first_byte;
  enum rfc5444_result result = RFC5444_OKAY;

  if (length > 65535) {
    return RFC5444_TOO_LARGE;
  }

  /* copy pointer to prevent writing over parameter */
  ptr = buffer;
  eob = buffer + length;

  /* initialize tlv context */
  memset(&context, 0, sizeof(context));
  context.type = RFC5444_CONTEXT_PACKET;
  context.reader = parser;

  /* read header of packet */
  first_byte = _rfc5444_get_u8(&ptr, eob, &result);
  context.pkt_version = rfc5444_get_pktversion(first_byte);
  context.pkt_flags = first_byte & RFC5444_PKT_FLAGMASK;

  if (context.pkt_version != 0) {
    /*
     * bad packet version, do not jump to cleanup_parse packet because
     * we have not allocated any resources at this point
     */
    return RFC5444_UNSUPPORTED_VERSION;
  }

  /* check for sequence number */
  context.has_pktseqno = ((context.pkt_flags & RFC5444_PKT_FLAG_SEQNO) != 0);
  if (context.has_pktseqno) {
    context.pkt_seqno = _rfc5444_get_u16(&ptr, eob, &result);
  }

  if (result != RFC5444_OKAY) {
    /*
     * error during parsing, do not jump to cleanup_parse packet because
     * we have not allocated any resources at this point
     */
    return result;
  }

  /* initialize avl_tree */
  avl_init(&entries, avl_comp_uint32, true);
  last_started = NULL;

  /* check for packet tlv */
  has_tlv = (context.pkt_flags & RFC5444_PKT_FLAG_TLV) != 0;
  if (has_tlv) {
    result = _parse_tlvblock(parser, &entries, &ptr, eob, 0);
    if (result != RFC5444_OKAY) {
      /*
       * error while parsing TLV block, do not jump to cleanup_parse packet because
       * we have not allocated any resources at this point
       */
      return result;
    }
  }

  /* update packet buffer pointer */
  context.pkt_buffer = buffer;
  context.pkt_size = length;

  /* handle packet consumers, call start callbacks */
  avl_for_each_element(&parser->packet_consumer, consumer, _node) {
    last_started = consumer;
    /* this one can drop a packet */
    if (consumer->start_callback != NULL) {
      context.consumer = consumer;
#if DISALLOW_CONSUMER_CONTEXT_DROP == false
      result =
#endif
        consumer->start_callback(&context);
#if DISALLOW_CONSUMER_CONTEXT_DROP == false
      if (result != RFC5444_OKAY) {
        goto cleanup_parse_packet;
      }
#endif
    }
    /* handle packet tlv consumers */
    if (has_tlv && (consumer->tlv_callback != NULL || consumer->block_callback != NULL)) {
      /* can drop packet */
#if DISALLOW_CONSUMER_CONTEXT_DROP == false
      result =
#endif
        _schedule_tlvblock(consumer, &context, &entries, 0);
#if DISALLOW_CONSUMER_CONTEXT_DROP == false
      if (result != RFC5444_OKAY) {
        goto cleanup_parse_packet;
      }
#endif
    }
  }

  /* parse messages */
  while (result == RFC5444_OKAY && ptr < eob) {
    /* can drop packet (need to be there for error handling too) */
    result = _handle_message(parser, &context, &ptr, eob);
  }

#if DISALLOW_CONSUMER_CONTEXT_DROP == false
cleanup_parse_packet:
#endif
  /* call end-of-context callback */
  if (!avl_is_empty(&parser->packet_consumer)) {
    avl_for_first_to_element_reverse(&parser->packet_consumer, last_started, consumer, _node) {
      if (consumer->end_callback) {
        context.consumer = consumer;
        consumer->end_callback(&context, result != RFC5444_OKAY);
      }
    }
  }
  _free_tlvblock(parser, &entries);

  /* do not tell caller about packet drop */
#if DISALLOW_CONSUMER_CONTEXT_DROP == false
  if (result == RFC5444_DROP_PACKET) {
    return RFC5444_OKAY;
  }
#endif
  return result;
}